

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void expect_set(char *function,char *parameter,char *file,int line,unsigned_long *values,
               size_t number_of_values,CheckParameterValue check_function,int count)

{
  CheckParameterValue check_function_00;
  code *__dest;
  char *in_R8;
  char *in_R9;
  CheckParameterEvent *unaff_retaddr;
  int in_stack_00000008;
  ValuePointer check_data;
  unsigned_long *set;
  CheckIntegerSet *check_integer_set;
  undefined8 in_stack_ffffffffffffffa8;
  int line_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  CheckParameterValue file_00;
  
  line_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  check_function_00 = (CheckParameterValue)malloc((long)in_R9 * 8 + 0x38);
  __dest = check_function_00 + 0x38;
  file_00 = check_function_00;
  _assert_true((unsigned_long)__dest,(char *)check_function_00,
               (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),line_00);
  _assert_true((unsigned_long)__dest,(char *)check_function_00,
               (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),line_00);
  memcpy(__dest,in_R8,(long)in_R9 << 3);
  *(code **)(file_00 + 0x28) = __dest;
  *(char **)(file_00 + 0x30) = in_R9;
  _expect_check(in_R8,in_R9,(char *)file_00,(int)((ulong)__dest >> 0x20),check_function_00,
                CONCAT44(in_stack_ffffffffffffffb4,check_data.value._0_4_),unaff_retaddr,
                in_stack_00000008);
  return;
}

Assistant:

static void expect_set(
        const char* const function, const char* const parameter,
        const char* const file, const int line,
        const LargestIntegralType values[], const size_t number_of_values,
        const CheckParameterValue check_function, const int count) {
    CheckIntegerSet * const check_integer_set =
        (CheckIntegerSet*)malloc(sizeof(*check_integer_set) +
               (sizeof(values[0]) * number_of_values));
    LargestIntegralType * const set = (LargestIntegralType*)(
        check_integer_set + 1);
    declare_initialize_value_pointer_pointer(check_data, check_integer_set);
    assert_non_null(values);
    assert_true(number_of_values);
    memcpy(set, values, number_of_values * sizeof(values[0]));
    check_integer_set->set = set;
    check_integer_set->size_of_set = number_of_values;
    _expect_check(
        function, parameter, file, line, check_function,
        check_data.value, &check_integer_set->event, count);
}